

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O3

bool __thiscall TripleBuffer<stStateCore>::changed(TripleBuffer<stStateCore> *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar2 == 0) {
    bVar1 = this->hasChanged;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return bVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool changed() {
        std::lock_guard<std::mutex> lock(mutex);
        return hasChanged;
    }